

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cc
# Opt level: O0

EventLoop * __thiscall tt::net::EventLoopThreadPool::getNextLoop(EventLoopThreadPool *this)

{
  bool bVar1;
  reference ppEVar2;
  value_type local_18;
  EventLoop *loop;
  EventLoopThreadPool *this_local;
  
  EventLoop::assertInLoopThread(this->baseLoop_);
  if ((this->started_ & 1U) != 0) {
    local_18 = this->baseLoop_;
    bVar1 = std::vector<tt::net::EventLoop_*,_std::allocator<tt::net::EventLoop_*>_>::empty
                      (&this->loops_);
    if (!bVar1) {
      ppEVar2 = std::vector<tt::net::EventLoop_*,_std::allocator<tt::net::EventLoop_*>_>::operator[]
                          (&this->loops_,(long)this->next_);
      local_18 = *ppEVar2;
      this->next_ = (this->next_ + 1) % this->numThreads_;
    }
    return local_18;
  }
  __assert_fail("started_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/EventLoopThreadPool.cc"
                ,0x1e,"EventLoop *tt::net::EventLoopThreadPool::getNextLoop()");
}

Assistant:

EventLoop *EventLoopThreadPool::getNextLoop() {
  baseLoop_->assertInLoopThread();
  assert(started_);
  EventLoop *loop = baseLoop_;
  if (!loops_.empty()) {
    loop = loops_[next_];
    next_ = (next_ + 1) % numThreads_;
  }
  return loop;
}